

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstatsindex_tests.cpp
# Opt level: O2

void __thiscall
coinstatsindex_tests::coinstatsindex_unclean_shutdown::test_method
          (coinstatsindex_unclean_shutdown *this)

{
  NodeContext *context;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *val;
  long lVar1;
  bool bVar2;
  readonly_property<bool> rVar3;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar4;
  Chainstate *chainstate;
  CChainParams *consensusParams;
  SignalInterrupt **ppSVar5;
  CScript *this_00;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  CCoinsViewCache *baseIn;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string file;
  const_string file_00;
  span<const_std::byte,_18446744073709551615UL> b;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  check_type in_stack_fffffffffffff710;
  check_type cVar8;
  undefined4 in_stack_fffffffffffff714;
  char *local_8d0;
  char *local_8c8;
  undefined1 *local_8c0;
  undefined1 *local_8b8;
  char *local_8b0;
  char *local_8a8;
  char *local_8a0;
  char *local_898;
  undefined1 *local_890;
  undefined1 *local_888;
  char *local_880;
  char *local_878;
  long *local_870;
  char *local_868;
  char *local_860;
  char *local_858;
  char *local_850;
  assertion_result local_848;
  char **local_830;
  assertion_result local_828;
  undefined1 *local_810;
  undefined1 *local_808;
  char *local_800;
  char *local_7f8;
  char *local_7f0;
  char *local_7e8;
  undefined1 *local_7e0;
  undefined1 *local_7d8;
  char *local_7d0;
  char *local_7c8;
  char *local_7c0;
  char *local_7b8;
  undefined1 *local_7b0;
  undefined1 *local_7a8;
  char *local_7a0;
  char *local_798;
  CBlockIndex *new_block_index;
  shared_ptr<const_CBlock> new_block;
  char *local_770;
  char *local_768;
  undefined1 *local_760;
  undefined1 *local_758;
  char *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  undefined1 *local_730;
  undefined1 *local_728;
  char *local_720;
  char *local_718;
  long *local_710;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock15;
  CCoinsViewCache view;
  BlockValidationState state;
  CBlock block;
  CScript script_pub_key;
  CoinStatsIndex index;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  context = &(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
             super_BasicTestingSetup.m_node;
  val = &(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
         super_BasicTestingSetup.m_node.chainman;
  puVar4 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (val,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coinstatsindex_tests.cpp"
                      ,0x53,"test_method","m_node.chainman");
  chainstate = ChainstateManager::ActiveChainstate
                         ((puVar4->_M_t).
                          super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                          .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  consensusParams = Params();
  interfaces::MakeChain((interfaces *)&local_710,context);
  pvVar6 = (iterator)0x0;
  CoinStatsIndex::CoinStatsIndex
            (&index,(unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>)
                    &local_710,0x100000,false,false);
  if (local_710 != (long *)0x0) {
    (**(code **)(*local_710 + 8))();
  }
  local_710 = (long *)0x0;
  local_720 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coinstatsindex_tests.cpp"
  ;
  local_718 = "";
  local_730 = &boost::unit_test::basic_cstring<char_const>::null;
  local_728 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = pvVar6;
  file.m_end = (iterator)0x57;
  file.m_begin = (iterator)&local_720;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_730,msg);
  bVar2 = BaseIndex::Init(&index.super_BaseIndex);
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  state.super_ValidationState<BlockValidationResult>._0_8_ = (long)"filter_index.Init()" + 7;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p = "";
  view.super_CCoinsViewBacked.base =
       (CCoinsView *)((ulong)view.super_CCoinsViewBacked.base & 0xffffffffffffff00);
  view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
       (_func_int **)&PTR__lazy_ostream_0113a070;
  view._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_740 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coinstatsindex_tests.cpp"
  ;
  local_738 = "";
  pvVar6 = (iterator)0x2;
  pvVar7 = (iterator)0x0;
  view.hashBlock.super_base_blob<256U>.m_data._M_elems._7_8_ = &state;
  block.super_CBlockHeader.nVersion._0_1_ = bVar2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&block,(lazy_ostream *)&view,2,0,WARN,
             CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),(size_t)&local_740,0x57);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc));
  local_750 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coinstatsindex_tests.cpp"
  ;
  local_748 = "";
  local_760 = &boost::unit_test::basic_cstring<char_const>::null;
  local_758 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar6;
  file_00.m_end = &DAT_00000058;
  file_00.m_begin = (iterator)&local_750;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_760,
             msg_00);
  block.super_CBlockHeader.nVersion._0_1_ = BaseIndex::StartBackgroundSync(&index.super_BaseIndex);
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  state.super_ValidationState<BlockValidationResult>._0_8_ =
       (long)"filter_index.StartBackgroundSync()" + 7;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p = "";
  view.super_CCoinsViewBacked.base =
       (CCoinsView *)((ulong)view.super_CCoinsViewBacked.base & 0xffffffffffffff00);
  view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
       (_func_int **)&PTR__lazy_ostream_0113a070;
  view._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_770 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coinstatsindex_tests.cpp"
  ;
  local_768 = "";
  view.hashBlock.super_base_blob<256U>.m_data._M_elems._7_8_ = &state;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&block,(lazy_ostream *)&view,2,0,WARN,
             CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),(size_t)&local_770,0x58);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc));
  ppSVar5 = inline_assertion_check<true,util::SignalInterrupt*&>
                      (&(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
                        super_BasicTestingSetup.m_node.shutdown,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coinstatsindex_tests.cpp"
                       ,0x59,"test_method","m_node.shutdown");
  IndexWaitSynced(&index.super_BaseIndex,*ppSVar5);
  new_block_index = (CBlockIndex *)0x0;
  new_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  new_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  block.super_CBlockHeader.nVersion = 0;
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  CKey::GetPubKey((CPubKey *)&view,&(this->super_TestChain100Setup).coinbaseKey);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&state,(CPubKey *)&view);
  b._M_extent._M_extent_value =
       (long)state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p -
       state.super_ValidationState<BlockValidationResult>._0_8_;
  b._M_ptr = (pointer)state.super_ValidationState<BlockValidationResult>._0_8_;
  this_00 = CScript::operator<<((CScript *)&block,b);
  other = &CScript::operator<<(this_00,OP_CHECKSIG)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&script_pub_key.super_CScriptBase,other);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&state);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&block);
  view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView = (_func_int **)0x0;
  view.super_CCoinsViewBacked.base = (CCoinsView *)0x0;
  view.m_deterministic = false;
  view.hashBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  view.hashBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  view.hashBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  view.hashBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  view.hashBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  view.hashBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  view.hashBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  TestChain100Setup::CreateBlock
            (&block,&this->super_TestChain100Setup,
             (vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)&view,
             &script_pub_key,chainstate);
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)&view);
  std::make_shared<CBlock,CBlock_const&>((CBlock *)&view);
  std::__shared_ptr<CBlock_const,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<CBlock_const,(__gnu_cxx::_Lock_policy)2> *)&new_block,
             (__shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2> *)&view);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&view.super_CCoinsViewBacked.base);
  pvVar6 = (iterator)0x62;
  pvVar7 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock15,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coinstatsindex_tests.cpp"
             ,0x62,false);
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2;
  state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
  state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_local_buf[0] = '\0';
  state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
  state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
  state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] = '\0';
  local_7a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coinstatsindex_tests.cpp"
  ;
  local_798 = "";
  local_7b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar7;
  msg_01.m_begin = pvVar6;
  file_01.m_end = (iterator)0x64;
  file_01.m_begin = (iterator)&local_7a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_7b0,
             msg_01);
  rVar3.super_class_property<bool>.value =
       (class_property<bool>)CheckBlock(&block,&state,&consensusParams->consensus,true,true);
  local_848.m_message.px = (element_type *)0x0;
  local_848.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_828._0_8_ = "CheckBlock(block, state, params.GetConsensus())";
  local_828.m_message.px = (element_type *)0xb6a420;
  view.super_CCoinsViewBacked.base =
       (CCoinsView *)((ulong)view.super_CCoinsViewBacked.base & 0xffffffffffffff00);
  view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
       (_func_int **)&PTR__lazy_ostream_0113a070;
  view._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_7c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coinstatsindex_tests.cpp"
  ;
  local_7b8 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  view.hashBlock.super_base_blob<256U>.m_data._M_elems._7_8_ = &local_828;
  local_848.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar3.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_848,(lazy_ostream *)&view,1,0,WARN,
             CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),(size_t)&local_7c0,100);
  boost::detail::shared_count::~shared_count(&local_848.m_message.pn);
  local_7d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coinstatsindex_tests.cpp"
  ;
  local_7c8 = "";
  local_7e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar7;
  msg_02.m_begin = pvVar6;
  file_02.m_end = (iterator)0x65;
  file_02.m_begin = (iterator)&local_7d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_7e0,
             msg_02);
  cVar8 = CHECK_MSG;
  local_848.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ChainstateManager::AcceptBlock
                 ((val->_M_t).
                  super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                  .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,&new_block,&state,
                  &new_block_index,true,(FlatFilePos *)0x0,(bool *)0x0,true);
  local_848.m_message.px = (element_type *)0x0;
  local_848.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_828._0_8_ =
       "m_node.chainman->AcceptBlock(new_block, state, &new_block_index, true, nullptr, nullptr, true)"
  ;
  local_828.m_message.px = (element_type *)0xb6a47f;
  view.super_CCoinsViewBacked.base =
       (CCoinsView *)((ulong)view.super_CCoinsViewBacked.base & 0xffffffffffffff00);
  view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
       (_func_int **)&PTR__lazy_ostream_0113a070;
  view._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_7f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coinstatsindex_tests.cpp"
  ;
  local_7e8 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  view.hashBlock.super_base_blob<256U>.m_data._M_elems._7_8_ = &local_828;
  boost::test_tools::tt_detail::report_assertion
            (&local_848,(lazy_ostream *)&view,1,0,WARN,CONCAT44(in_stack_fffffffffffff714,cVar8),
             (size_t)&local_7f0,0x65);
  boost::detail::shared_count::~shared_count(&local_848.m_message.pn);
  baseIn = Chainstate::CoinsTip(chainstate);
  CCoinsViewCache::CCoinsViewCache(&view,(CCoinsView *)baseIn,false);
  local_800 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coinstatsindex_tests.cpp"
  ;
  local_7f8 = "";
  local_810 = &boost::unit_test::basic_cstring<char_const>::null;
  local_808 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar7;
  msg_03.m_begin = pvVar6;
  file_03.m_end = (iterator)0x67;
  file_03.m_begin = (iterator)&local_800;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_810,
             msg_03);
  bVar2 = Chainstate::ConnectBlock(chainstate,&block,&state,new_block_index,&view,false);
  local_828.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar2;
  local_828.m_message.px = (element_type *)0x0;
  local_828.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_830 = &local_858;
  local_858 = "chainstate.ConnectBlock(block, state, new_block_index, view)";
  local_850 = "";
  local_848.m_message.px = (element_type *)((ulong)local_848.m_message.px & 0xffffffffffffff00);
  local_848._0_8_ = &PTR__lazy_ostream_0113a070;
  local_848.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_868 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coinstatsindex_tests.cpp"
  ;
  local_860 = "";
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_828,(lazy_ostream *)&local_848,1,0,WARN,
             CONCAT44(in_stack_fffffffffffff714,cVar8),(size_t)&local_868,0x67);
  boost::detail::shared_count::~shared_count(&local_828.m_message.pn);
  CCoinsViewCache::~CCoinsViewCache(&view);
  ValidationState<BlockValidationResult>::~ValidationState
            (&state.super_ValidationState<BlockValidationResult>);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock15.super_unique_lock);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&block.vtx);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&script_pub_key.super_CScriptBase);
  ValidationInterfaceTest::BlockConnected
            (NORMAL,(CValidationInterface *)&index,&new_block,new_block_index);
  BaseIndex::Stop(&index.super_BaseIndex);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&new_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  CoinStatsIndex::~CoinStatsIndex(&index);
  interfaces::MakeChain((interfaces *)&local_870,context);
  pvVar6 = (iterator)0x0;
  CoinStatsIndex::CoinStatsIndex
            (&index,(unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>)
                    &local_870,0x100000,false,false);
  if (local_870 != (long *)0x0) {
    (**(code **)(*local_870 + 8))();
  }
  local_870 = (long *)0x0;
  local_880 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coinstatsindex_tests.cpp"
  ;
  local_878 = "";
  local_890 = &boost::unit_test::basic_cstring<char_const>::null;
  local_888 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar7;
  msg_04.m_begin = pvVar6;
  file_04.m_end = (iterator)0x72;
  file_04.m_begin = (iterator)&local_880;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_890,
             msg_04);
  bVar2 = BaseIndex::Init(&index.super_BaseIndex);
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  state.super_ValidationState<BlockValidationResult>._0_8_ = (long)"filter_index.Init()" + 7;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p = "";
  view.super_CCoinsViewBacked.base =
       (CCoinsView *)((ulong)view.super_CCoinsViewBacked.base & 0xffffffffffffff00);
  view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
       (_func_int **)&PTR__lazy_ostream_0113a070;
  view._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_8a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coinstatsindex_tests.cpp"
  ;
  local_898 = "";
  pvVar6 = (iterator)0x2;
  pvVar7 = (iterator)0x0;
  view.hashBlock.super_base_blob<256U>.m_data._M_elems._7_8_ =
       &state.super_ValidationState<BlockValidationResult>;
  block.super_CBlockHeader.nVersion._0_1_ = bVar2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&block,(lazy_ostream *)&view,2,0,WARN,
             CONCAT44(in_stack_fffffffffffff714,cVar8),(size_t)&local_8a0,0x72);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc));
  local_8b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coinstatsindex_tests.cpp"
  ;
  local_8a8 = "";
  local_8c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar7;
  msg_05.m_begin = pvVar6;
  file_05.m_end = (iterator)0x74;
  file_05.m_begin = (iterator)&local_8b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_8c0,
             msg_05);
  block.super_CBlockHeader.nVersion._0_1_ = BaseIndex::StartBackgroundSync(&index.super_BaseIndex);
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  state.super_ValidationState<BlockValidationResult>._0_8_ =
       (long)"filter_index.StartBackgroundSync()" + 7;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p = "";
  view.super_CCoinsViewBacked.base =
       (CCoinsView *)((ulong)view.super_CCoinsViewBacked.base & 0xffffffffffffff00);
  view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
       (_func_int **)&PTR__lazy_ostream_0113a070;
  view._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_8d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coinstatsindex_tests.cpp"
  ;
  local_8c8 = "";
  view.hashBlock.super_base_blob<256U>.m_data._M_elems._7_8_ =
       &state.super_ValidationState<BlockValidationResult>;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&block,(lazy_ostream *)&view,2,0,WARN,
             CONCAT44(in_stack_fffffffffffff714,cVar8),(size_t)&local_8d0,0x74);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc));
  BaseIndex::Stop(&index.super_BaseIndex);
  CoinStatsIndex::~CoinStatsIndex(&index);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(coinstatsindex_unclean_shutdown, TestChain100Setup)
{
    Chainstate& chainstate = Assert(m_node.chainman)->ActiveChainstate();
    const CChainParams& params = Params();
    {
        CoinStatsIndex index{interfaces::MakeChain(m_node), 1 << 20};
        BOOST_REQUIRE(index.Init());
        BOOST_REQUIRE(index.StartBackgroundSync());
        IndexWaitSynced(index, *Assert(m_node.shutdown));
        std::shared_ptr<const CBlock> new_block;
        CBlockIndex* new_block_index = nullptr;
        {
            const CScript script_pub_key{CScript() << ToByteVector(coinbaseKey.GetPubKey()) << OP_CHECKSIG};
            const CBlock block = this->CreateBlock({}, script_pub_key, chainstate);

            new_block = std::make_shared<CBlock>(block);

            LOCK(cs_main);
            BlockValidationState state;
            BOOST_CHECK(CheckBlock(block, state, params.GetConsensus()));
            BOOST_CHECK(m_node.chainman->AcceptBlock(new_block, state, &new_block_index, true, nullptr, nullptr, true));
            CCoinsViewCache view(&chainstate.CoinsTip());
            BOOST_CHECK(chainstate.ConnectBlock(block, state, new_block_index, view));
        }
        // Send block connected notification, then stop the index without
        // sending a chainstate flushed notification. Prior to #24138, this
        // would cause the index to be corrupted and fail to reload.
        ValidationInterfaceTest::BlockConnected(ChainstateRole::NORMAL, index, new_block, new_block_index);
        index.Stop();
    }

    {
        CoinStatsIndex index{interfaces::MakeChain(m_node), 1 << 20};
        BOOST_REQUIRE(index.Init());
        // Make sure the index can be loaded.
        BOOST_REQUIRE(index.StartBackgroundSync());
        index.Stop();
    }
}